

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit.hpp
# Opt level: O3

void __thiscall boost::unit_test::test_suite::~test_suite(test_suite *this)

{
  pointer puVar1;
  
  this->_vptr_test_suite = (_func_int **)&PTR__test_suite_001c92e0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_ranked_children)._M_t);
  puVar1 = (this->m_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_children).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  test_unit::~test_unit(&this->super_test_unit);
  return;
}

Assistant:

virtual         ~test_suite() {}